

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

TEdge * __thiscall ClipperLib::ClipperBase::AddBoundsToLML(ClipperBase *this,TEdge *e)

{
  LocalMinima *newLm_00;
  LocalMinima *newLm;
  TEdge *e_local;
  ClipperBase *this_local;
  
  e->nextInLML = (TEdge *)0x0;
  newLm = (LocalMinima *)e->next;
  do {
    if (((double)newLm[1].rightBound - -1e+40 <= -1e-20) ||
       (1e-20 <= (double)newLm[1].rightBound - -1e+40)) {
      if (newLm->next == *(LocalMinima **)(newLm[3].Y + 0x18)) goto LAB_00ba2cb5;
      newLm[3].leftBound = (TEdge *)newLm[3].Y;
    }
    else {
      if (((long)newLm[2].next[1].leftBound < (long)newLm[1].leftBound) &&
         (*(long *)newLm[3].Y < (newLm[2].next)->Y)) {
LAB_00ba2cb5:
        newLm_00 = (LocalMinima *)operator_new(0x20);
        newLm_00->next = (LocalMinima *)0x0;
        newLm_00->Y = *(long64 *)(newLm[3].Y + 8);
        if (((double)newLm[1].rightBound - -1e+40 <= -1e-20) ||
           (1e-20 <= (double)newLm[1].rightBound - -1e+40)) {
          if (*(double *)(newLm[3].Y + 0x30) <= (double)newLm[1].rightBound) {
            newLm_00->leftBound = (TEdge *)newLm;
            newLm_00->rightBound = (TEdge *)newLm[3].Y;
          }
          else {
            newLm_00->leftBound = (TEdge *)newLm[3].Y;
            newLm_00->rightBound = (TEdge *)newLm;
          }
        }
        else {
          if (newLm->Y != *(long *)newLm[3].Y) {
            SwapX((TEdge *)newLm);
          }
          newLm_00->leftBound = (TEdge *)newLm[3].Y;
          newLm_00->rightBound = (TEdge *)newLm;
        }
        newLm_00->leftBound->side = esLeft;
        newLm_00->rightBound->side = esRight;
        InsertLocalMinima(this,newLm_00);
        while ((newLm[2].next[1].leftBound != newLm[1].leftBound ||
               ((-1e-20 < (double)newLm[2].next[1].rightBound - -1e+40 &&
                ((double)newLm[2].next[1].rightBound - -1e+40 < 1e-20))))) {
          newLm[3].leftBound = (TEdge *)newLm[2].next;
          newLm = newLm[2].next;
          if ((-1e-20 < ((TEdge *)newLm)->dx - -1e+40) &&
             ((((TEdge *)newLm)->dx - -1e+40 < 1e-20 &&
              (((TEdge *)newLm)->xbot != ((TEdge *)newLm)->prev->xtop)))) {
            SwapX((TEdge *)newLm);
          }
        }
        return (TEdge *)newLm[2].next;
      }
      if (newLm[1].Y != *(long *)newLm[3].Y) {
        SwapX((TEdge *)newLm);
      }
      newLm[3].leftBound = (TEdge *)newLm[3].Y;
    }
    newLm = newLm[2].next;
  } while( true );
}

Assistant:

TEdge* ClipperBase::AddBoundsToLML(TEdge *e)
{
  //Starting at the top of one bound we progress to the bottom where there's
  //a local minima. We then go to the top of the next bound. These two bounds
  //form the left and right (or right and left) bounds of the local minima.
  e->nextInLML = 0;
  e = e->next;
  for (;;)
  {
    if (NEAR_EQUAL(e->dx, HORIZONTAL))
    {
      //nb: proceed through horizontals when approaching from their right,
      //    but break on horizontal minima if approaching from their left.
      //    This ensures 'local minima' are always on the left of horizontals.
      if (e->next->ytop < e->ytop && e->next->xbot > e->prev->xbot) break;
      if (e->xtop != e->prev->xbot) SwapX(*e);
      e->nextInLML = e->prev;
    }
    else if (e->ycurr == e->prev->ycurr) break;
    else e->nextInLML = e->prev;
    e = e->next;
  }

  //e and e.prev are now at a local minima ...
  LocalMinima* newLm = new LocalMinima;
  newLm->next = 0;
  newLm->Y = e->prev->ybot;

  if ( NEAR_EQUAL(e->dx, HORIZONTAL) ) //horizontal edges never start a left bound
  {
    if (e->xbot != e->prev->xbot) SwapX(*e);
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else if (e->dx < e->prev->dx)
  {
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else
  {
    newLm->leftBound = e;
    newLm->rightBound = e->prev;
  }
  newLm->leftBound->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima( newLm );

  for (;;)
  {
    if ( e->next->ytop == e->ytop && !NEAR_EQUAL(e->next->dx, HORIZONTAL) ) break;
    e->nextInLML = e->next;
    e = e->next;
    if ( NEAR_EQUAL(e->dx, HORIZONTAL) && e->xbot != e->prev->xtop) SwapX(*e);
  }
  return e->next;
}